

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

void __thiscall llvm::raw_null_ostream::~raw_null_ostream(raw_null_ostream *this)

{
  raw_null_ostream *this_local;
  
  (this->super_raw_pwrite_stream).super_raw_ostream._vptr_raw_ostream =
       (_func_int **)&PTR__raw_null_ostream_0271e7f8;
  raw_ostream::flush((raw_ostream *)this);
  raw_pwrite_stream::~raw_pwrite_stream(&this->super_raw_pwrite_stream);
  return;
}

Assistant:

raw_null_ostream::~raw_null_ostream() {
#ifndef NDEBUG
  // ~raw_ostream asserts that the buffer is empty. This isn't necessary
  // with raw_null_ostream, but it's better to have raw_null_ostream follow
  // the rules than to change the rules just for raw_null_ostream.
  flush();
#endif
}